

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O3

void __thiscall MessageQueue::MessageQueue(MessageQueue *this,Path *path,CreateFlag flag)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  key_t __key;
  int iVar4;
  uint __msgflg;
  undefined1 local_39;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  MessageQueue *local_20;
  
  this->queue = -1;
  this->owner = false;
  (this->signalDataAvailable).id = 0;
  (this->signalDataAvailable).mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->signalDataAvailable).mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->signalDataAvailable).mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->signalDataAvailable).mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->signalDataAvailable).mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  p_Var1 = &(this->signalDataAvailable).connections._M_t._M_impl.super__Rb_tree_header;
  (this->signalDataAvailable).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->signalDataAvailable).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->signalDataAvailable).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->signalDataAvailable).connections._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->signalDataAvailable).connections._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pthread_once(&msgInitOnce,msgInit);
  __key = ftok((path->super_String).mString._M_dataplus._M_p,0xf6b);
  if (__key != -1) {
    __msgflg = 0x600;
    if (flag != Create) {
      __msgflg = 0;
    }
    iVar4 = msgget(__key,__msgflg);
    this->queue = iVar4;
    this->owner = (bool)((byte)(__msgflg >> 9) & 1);
    local_20 = this;
    std::__shared_ptr<MessageThread,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<MessageThread>,int&,MessageQueue*>
              ((__shared_ptr<MessageThread,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<MessageThread> *)&local_39,&this->queue,&local_20);
    p_Var3 = p_Stack_30;
    peVar2 = local_38;
    local_38 = (element_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      }
    }
    Thread::start(&((this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_Thread,Normal,0);
  }
  return;
}

Assistant:

MessageQueue::MessageQueue(const Path& path, CreateFlag flag)
    : queue(-1), owner(false)
{
    pthread_once(&msgInitOnce, msgInit);
    const key_t key = ftok(path.nullTerminated(), PROJID);
    if (key == -1)
        return;
    const int flg = (flag == Create) ? (IPC_CREAT | IPC_EXCL) : 0;
    queue = msgget(key, flg);
    owner = ((flg & IPC_CREAT) == IPC_CREAT);
    thread = std::make_shared<MessageThread>(queue, this);
    thread->start();
}